

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O0

int compare_timer_contexts(void *av,void *bv)

{
  char *b;
  char *a;
  void *bv_local;
  void *av_local;
  
  if (av < bv) {
    av_local._4_4_ = -1;
  }
  else if (bv < av) {
    av_local._4_4_ = 1;
  }
  else {
    av_local._4_4_ = 0;
  }
  return av_local._4_4_;
}

Assistant:

static int compare_timer_contexts(void *av, void *bv)
{
    char *a = (char *)av;
    char *b = (char *)bv;
    if (a < b)
        return -1;
    else if (a > b)
        return +1;
    return 0;
}